

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptMethod Js::ScriptContext::GetProfileModeThunk(JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptMethod entryPoint_local;
  
  BVar3 = IsIntermediateCodeGenThunk(entryPoint);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x10c5,"(!IsIntermediateCodeGenThunk(entryPoint))",
                                "!IsIntermediateCodeGenThunk(entryPoint)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((entryPoint == JavascriptFunction::DeferredParsingThunk) ||
     (entryPoint == ProfileModeDeferredParsingThunk)) {
    entryPoint_local = ProfileModeDeferredParsingThunk;
  }
  else if ((entryPoint == JavascriptFunction::DeferredDeserializeThunk) ||
          (entryPoint == ProfileModeDeferredDeserializeThunk)) {
    entryPoint_local = ProfileModeDeferredDeserializeThunk;
  }
  else {
    bVar2 = CrossSite::IsThunk(entryPoint);
    if (bVar2) {
      entryPoint_local = CrossSite::ProfileThunk;
    }
    else {
      entryPoint_local = DebugProfileProbeThunk;
    }
  }
  return entryPoint_local;
}

Assistant:

JavascriptMethod ScriptContext::GetProfileModeThunk(JavascriptMethod entryPoint)
    {
    #if ENABLE_NATIVE_CODEGEN
        Assert(!IsIntermediateCodeGenThunk(entryPoint));
    #endif
        if (entryPoint == DefaultDeferredParsingThunk || entryPoint == ProfileDeferredParsingThunk)
        {
            return ProfileDeferredParsingThunk;
        }

        if (entryPoint == DefaultDeferredDeserializeThunk || entryPoint == ProfileDeferredDeserializeThunk)
        {
            return ProfileDeferredDeserializeThunk;
        }

        if (CrossSite::IsThunk(entryPoint))
        {
            return CrossSite::ProfileThunk;
        }
        return ProfileEntryThunk;
    }